

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::SharedColorbufferTest::SharedColorbufferTest
          (SharedColorbufferTest *this,Context *context,FboConfig *config)

{
  string local_40;
  
  FboConfig::getName_abi_cxx11_(&local_40,config);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_40._M_dataplus._M_p,"Shared colorbuffer",
             config);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e3cbc0;
  return;
}

Assistant:

SharedColorbufferTest::SharedColorbufferTest (Context& context, const FboConfig& config)
	: FboRenderCase	(context, config.getName().c_str(), "Shared colorbuffer", config)
{
}